

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:264:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:264:7)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  PromiseNode *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __pid_t _Var4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar6;
  char buf [4];
  char local_1b4 [4];
  Own<kj::_::PromiseNode> local_1b0;
  uint local_19c;
  ExceptionOrValue local_198;
  char local_38;
  
  (**(params_1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_1b0,&params_1->super_AsyncOutputStream,"foo",3);
  local_198.exception.ptr._0_8_ = local_198.exception.ptr._0_8_ & 0xffffffffffffff00;
  local_38 = '\0';
  _::waitImpl(&local_1b0,&local_198,params_2);
  if (local_38 == '\x01') {
    if (local_198.exception.ptr.isSet != false) {
      throwRecoverableException(&local_198.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_198.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_198.exception.ptr.field_1.value,0);
  }
  if (local_198.exception.ptr.isSet == true) {
    Exception::~Exception(&local_198.exception.ptr.field_1.value);
  }
  pPVar1 = local_1b0.ptr;
  if (local_1b0.ptr != (PromiseNode *)0x0) {
    local_1b0.ptr = (PromiseNode *)0x0;
    (**(local_1b0.disposer)->_vptr_Disposer)
              (local_1b0.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
            ((Promise<unsigned_long> *)&local_198,params_1,local_1b4,3,4);
  _Var4 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_198,params_2);
  uVar3 = local_198.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((long *)local_198.exception.ptr.field_1.value.ownFile.content.ptr != (long *)0x0) {
    local_198.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_198.exception.ptr._0_8_)
              (local_198.exception.ptr._0_8_,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
  }
  if ((CONCAT44(extraout_var,_Var4) != 3) && (_::Debug::minSeverity < 3)) {
    local_19c = 3;
    (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              ((Promise<unsigned_long> *)&local_198,params_1,local_1b4,3,4);
    _Var4 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_198,params_2);
    local_1b0.disposer = (Disposer *)CONCAT44(extraout_var_00,_Var4);
    _::Debug::log<char_const(&)[69],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x10b,ERROR,
               "\"failed: expected \" \"(3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))\", 3u, stream.tryRead(buf, 3, 4).wait(waitScope)"
               ,(char (*) [69])
                "failed: expected (3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))",&local_19c,
               (unsigned_long *)&local_1b0);
    uVar3 = local_198.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((long *)local_198.exception.ptr.field_1.value.ownFile.content.ptr != (long *)0x0) {
      local_198.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_198.exception.ptr._0_8_)
                (local_198.exception.ptr._0_8_,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
    }
  }
  heapString((String *)&local_198,local_1b4,3);
  uVar3 = local_198.exception.ptr.field_1.value.ownFile.content.ptr;
  bVar6 = true;
  if (local_198.exception.ptr.field_1.value.ownFile.content.ptr == &DAT_00000004) {
    iVar5 = bcmp((void *)local_198.exception.ptr._0_8_,"bar",3);
    bVar6 = iVar5 != 0;
  }
  uVar2 = local_198.exception.ptr._0_8_;
  if ((Disposer *)local_198.exception.ptr._0_8_ != (Disposer *)0x0) {
    local_198.exception.ptr._0_8_ = (Disposer *)0x0;
    local_198.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_198.exception.ptr.field_1.value.ownFile.content.size_)
              (local_198.exception.ptr.field_1.value.ownFile.content.size_,uVar2,1,uVar3,uVar3,0);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    heapString((String *)&local_198,local_1b4,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x10c,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (heapString(buf, 3))\", \"bar\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"bar\") == (heapString(buf, 3))",
               (char (*) [4])0x3892c8,(String *)&local_198);
    uVar2 = local_198.exception.ptr.field_1.value.ownFile.content.ptr;
    uVar3 = local_198.exception.ptr._0_8_;
    if ((Disposer *)local_198.exception.ptr._0_8_ != (Disposer *)0x0) {
      local_198.exception.ptr._0_8_ = (Disposer *)0x0;
      local_198.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_198.exception.ptr.field_1.value.ownFile.content.size_)
                (local_198.exception.ptr.field_1.value.ownFile.content.size_,uVar3,1,uVar2,uVar2,0);
    }
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }